

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

void __thiscall helics::CoreApp::reset(CoreApp *this)

{
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  
  CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x44b8b6);
  return;
}

Assistant:

void CoreApp::reset()
{
    core.reset();
    name.clear();
}